

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  bool bVar1;
  TestRunOrder TVar2;
  TestRunOrder TVar3;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_30;
  IConfig *local_18;
  IConfig *config_local;
  TestRegistry *this_local;
  
  local_18 = config;
  config_local = (IConfig *)this;
  bVar1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::empty
                    (&this->m_sortedFunctions);
  if (bVar1) {
    enforceNoDuplicateTestCases(&this->m_handles);
  }
  TVar3 = this->m_currentSortOrder;
  TVar2 = (*local_18->_vptr_IConfig[0x10])();
  if ((TVar3 != TVar2) ||
     (bVar1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::empty
                        (&this->m_sortedFunctions), bVar1)) {
    sortTests(&local_30,local_18,&this->m_handles);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::operator=
              (&this->m_sortedFunctions,&local_30);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~vector(&local_30);
    TVar3 = (*local_18->_vptr_IConfig[0x10])();
    this->m_currentSortOrder = TVar3;
  }
  return &this->m_sortedFunctions;
}

Assistant:

std::vector<TestCaseHandle> const &TestRegistry::getAllTestsSorted(IConfig const &config) const {
        if (m_sortedFunctions.empty())
            enforceNoDuplicateTestCases(m_handles);

        if (m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty()) {
            m_sortedFunctions = sortTests(config, m_handles);
            m_currentSortOrder = config.runOrder();
        }
        return m_sortedFunctions;
    }